

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

ssize_t __thiscall
cpp_client::Connection::send(Connection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  rep rVar1;
  ostream *poVar2;
  pointer pCVar3;
  long lVar4;
  ssize_t sVar5;
  size_t __n_00;
  void *__buf_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  __cxx11 local_e8 [32];
  string local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  string local_88 [48];
  string local_58 [32];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_38;
  duration<long,_std::ratio<1L,_1000000000L>_> local_30;
  duration<long,_std::ratio<1L,_1000L>_> local_28;
  rep local_20;
  rep time;
  string *msg_local;
  Connection *this_local;
  
  time = CONCAT44(in_register_00000034,__fd);
  msg_local = (string *)this;
  local_38.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_30.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_38);
  local_28.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_30);
  local_20 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_28);
  if ((this->print_communication_ & 1U) != 0) {
    poVar2 = ::operator<<((ostream *)&std::cout,text_magenta);
    poVar2 = std::operator<<(poVar2,"TO SERVER --> ");
    rVar1 = time;
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_58,rVar1);
    poVar2 = std::operator<<(poVar2,local_58);
    poVar2 = std::operator<<(poVar2,", \"sentTime\": ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20);
    poVar2 = std::operator<<(poVar2,"}");
    poVar2 = ::operator<<(poVar2,normal);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string(local_58);
  }
  pCVar3 = std::
           unique_ptr<cpp_client::Connection_internal,_std::default_delete<cpp_client::Connection_internal>_>
           ::operator->(&this->conn_);
  rVar1 = time;
  lVar4 = std::__cxx11::string::size();
  __n_00 = lVar4 - 1;
  std::__cxx11::string::substr((ulong)local_88,rVar1);
  Connection_internal::send(pCVar3,(int)local_88,__buf_00,__n_00,__flags);
  std::__cxx11::string::~string(local_88);
  pCVar3 = std::
           unique_ptr<cpp_client::Connection_internal,_std::default_delete<cpp_client::Connection_internal>_>
           ::operator->(&this->conn_);
  std::__cxx11::to_string(local_e8,local_20);
  std::operator+((char *)local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ", \"sentTime\": ");
  std::operator+(local_a8,(char *)local_c8);
  Connection_internal::send(pCVar3,(int)local_a8,__buf_01,__n_00,__flags);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string(local_c8);
  sVar5 = std::__cxx11::string::~string((string *)local_e8);
  return sVar5;
}

Assistant:

void Connection::send(const std::string& msg)
{
   using namespace std::chrono;
   const auto time = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count();
   if(print_communication_)
   {
      std::cout << sgr::text_magenta
                << "TO SERVER --> "
                << msg.substr(0, msg.size() - 1)
                << ", \"sentTime\": "
                << time << "}"
                << sgr::reset
                << '\n';
   }
   //cut out the last } and append the time sent
   conn_->send(msg.substr(0, msg.size() - 1));
   conn_->send(R"(, "sentTime": )" + std::to_string(time) + "}\x04");
}